

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O0

int INT_EVstore_is_sending(CManager_conflict cm,EVstone stone_num,EVaction action_num)

{
  stone_type p_Var1;
  int in_EDX;
  proto_action *p;
  stone_type stone;
  event_path_data evp;
  event_path_data in_stack_ffffffffffffffc8;
  int local_4;
  
  p_Var1 = stone_struct(in_stack_ffffffffffffffc8,0);
  if (p_Var1 == (stone_type)0x0) {
    local_4 = -1;
  }
  else {
    local_4 = p_Var1->proto_actions[in_EDX].o.bri.remote_stone_id;
  }
  return local_4;
}

Assistant:

int
INT_EVstore_is_sending(CManager cm, EVstone stone_num, EVaction action_num)
{
    event_path_data evp = cm->evp;
    stone_type stone;;
    proto_action *p;

    stone = stone_struct(evp, stone_num);
    if (!stone) return -1;

    p = &stone->proto_actions[action_num];
    return p->o.store.is_sending;
}